

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_decoder_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PriceSyncDecoderTest::PriceSyncDecoderTest
          (PriceSyncDecoderTest *this)

{
  ExtendableDataDictionary *pEVar1;
  long *local_168 [2];
  long local_158 [2];
  long *local_148 [2];
  long local_138 [2];
  long *local_128 [2];
  long local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  FieldDef local_e8 [8];
  long *local_e0;
  long local_d0 [3];
  FieldDef local_b8 [8];
  long *local_b0;
  long local_a0 [3];
  FieldDef local_88 [8];
  long *local_80;
  long local_70 [3];
  FieldDef local_58 [8];
  long *local_50;
  long local_40 [3];
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PriceSyncDecoderTest_002977d0;
  bidfx_public_api::price::pixie::PriceSyncDecoder::PriceSyncDecoder(&this->decoder);
  *(code **)&this->data_dictionary = bidfx_public_api::tools::ByteBuffer::WriteShort;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  *(undefined1 **)&this->field_0x38 = &this->field_0x28;
  *(undefined1 **)&this->field_0x40 = &this->field_0x28;
  *(undefined8 *)&this->field_0x48 = 0;
  *(undefined8 *)&this->field_0x50 = 0;
  *(undefined8 *)&this->field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined1 **)&this->field_0x68 = &this->field_0x58;
  *(undefined1 **)&this->field_0x70 = &this->field_0x58;
  *(undefined8 *)&this->field_0x78 = 0;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Bid","");
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_58,0,0x44,local_108);
  pEVar1 = &this->data_dictionary;
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(pEVar1,local_58);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"BidSize","");
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_88,1,0x4c,local_128);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(pEVar1,local_88);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Ask","");
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_b8,2,0x44,local_148);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(pEVar1,local_b8);
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"AskSize","");
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_e8,3,0x4c,local_168);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(pEVar1,local_e8);
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  return;
}

Assistant:

PriceSyncDecoderTest()
    {
        data_dictionary.AddFieldDef(FieldDef(0, FieldTypeEnum::DOUBLE, "Bid"));
        data_dictionary.AddFieldDef(FieldDef(1, FieldTypeEnum::LONG, "BidSize"));
        data_dictionary.AddFieldDef(FieldDef(2, FieldTypeEnum::DOUBLE, "Ask"));
        data_dictionary.AddFieldDef(FieldDef(3, FieldTypeEnum::LONG, "AskSize"));
    }